

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetWindowConditionAllowFlags(ImGuiWindow *window,ImGuiCond flags,bool enabled)

{
  uint local_1c;
  uint local_18;
  uint local_14;
  bool enabled_local;
  ImGuiCond flags_local;
  ImGuiWindow *window_local;
  
  if (enabled) {
    local_14 = (char)*(undefined4 *)&window->field_0xaf | flags;
  }
  else {
    local_14 = (int)(char)*(undefined4 *)&window->field_0xaf & (flags ^ 0xffffffffU);
  }
  *(uint *)&window->field_0xaf = *(uint *)&window->field_0xaf & 0xffffff00 | local_14 & 0xff;
  if (enabled) {
    local_18 = (*(int *)&window->field_0xaf << 0x10) >> 0x18 | flags;
  }
  else {
    local_18 = (*(int *)&window->field_0xaf << 0x10) >> 0x18 & (flags ^ 0xffffffffU);
  }
  *(uint *)&window->field_0xaf = *(uint *)&window->field_0xaf & 0xffff00ff | (local_18 & 0xff) << 8;
  if (enabled) {
    local_1c = (*(int *)&window->field_0xaf << 8) >> 0x18 | flags;
  }
  else {
    local_1c = (*(int *)&window->field_0xaf << 8) >> 0x18 & (flags ^ 0xffffffffU);
  }
  *(uint *)&window->field_0xaf =
       *(uint *)&window->field_0xaf & 0xff00ffff | (local_1c & 0xff) << 0x10;
  return;
}

Assistant:

static void SetWindowConditionAllowFlags(ImGuiWindow* window, ImGuiCond flags, bool enabled)
{
    window->SetWindowPosAllowFlags       = enabled ? (window->SetWindowPosAllowFlags       | flags) : (window->SetWindowPosAllowFlags       & ~flags);
    window->SetWindowSizeAllowFlags      = enabled ? (window->SetWindowSizeAllowFlags      | flags) : (window->SetWindowSizeAllowFlags      & ~flags);
    window->SetWindowCollapsedAllowFlags = enabled ? (window->SetWindowCollapsedAllowFlags | flags) : (window->SetWindowCollapsedAllowFlags & ~flags);
}